

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

void __thiscall om::concurrency::queue<int>::enqueue(queue<int> *this,int item_)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  int item__local;
  queue<int> *this_local;
  
  lock._M_device._4_4_ = item_;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_mutex);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            (&this->_queue,(value_type *)((long)&lock._M_device + 4));
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void enqueue(T item_)
			{
				std::lock_guard<std::mutex> lock(_mutex);
				_queue.push(std::move(item_));
				_condition.notify_one();
			}